

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
__thiscall
duckdb::JoinFilterPushdownInfo::GetGlobalState
          (JoinFilterPushdownInfo *this,ClientContext *context,PhysicalOperator *op)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  GlobalUngroupedAggregateState *__ptr_00;
  DynamicTableFilterSet *this_00;
  pointer puVar2;
  Allocator *client_allocator;
  GlobalUngroupedAggregateState *this_01;
  default_delete<duckdb::GlobalUngroupedAggregateState> *this_02;
  PhysicalOperator *in_RCX;
  pointer *__ptr;
  pointer __p;
  JoinFilterPushdownFilter *info;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  GlobalUngroupedAggregateState *local_38;
  
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&context->interrupted;
  for (this_03 = (context->db).internal.
                 super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi; this_03 != p_Var1;
      this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this_03[2]._M_use_count) {
    this_00 = shared_ptr<duckdb::DynamicTableFilterSet,_true>::operator->
                        ((shared_ptr<duckdb::DynamicTableFilterSet,_true> *)this_03);
    DynamicTableFilterSet::ClearFilters(this_00,in_RCX);
  }
  puVar2 = (pointer)operator_new(8);
  *puVar2 = 0;
  (this->join_condition).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = puVar2;
  client_allocator = BufferAllocator::Get((ClientContext *)op);
  this_01 = (GlobalUngroupedAggregateState *)operator_new(0xe8);
  GlobalUngroupedAggregateState::GlobalUngroupedAggregateState
            (this_01,client_allocator,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&context->logger);
  local_38 = this_01;
  this_02 = (default_delete<duckdb::GlobalUngroupedAggregateState> *)
            unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
            ::operator->((unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>,_true>
                          *)this);
  local_38 = (GlobalUngroupedAggregateState *)0x0;
  __ptr_00 = *(GlobalUngroupedAggregateState **)this_02;
  *(GlobalUngroupedAggregateState **)this_02 = this_01;
  if (__ptr_00 != (GlobalUngroupedAggregateState *)0x0) {
    ::std::default_delete<duckdb::GlobalUngroupedAggregateState>::operator()(this_02,__ptr_00);
  }
  if (local_38 != (GlobalUngroupedAggregateState *)0x0) {
    ::std::default_delete<duckdb::GlobalUngroupedAggregateState>::operator()
              ((default_delete<duckdb::GlobalUngroupedAggregateState> *)&local_38,local_38);
  }
  return (unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
          )(unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
            )this;
}

Assistant:

unique_ptr<JoinFilterGlobalState> JoinFilterPushdownInfo::GetGlobalState(ClientContext &context,
                                                                         const PhysicalOperator &op) const {
	// clear any previously set filters
	// we can have previous filters for this operator in case of e.g. recursive CTEs
	for (auto &info : probe_info) {
		info.dynamic_filters->ClearFilters(op);
	}
	auto result = make_uniq<JoinFilterGlobalState>();
	result->global_aggregate_state =
	    make_uniq<GlobalUngroupedAggregateState>(BufferAllocator::Get(context), min_max_aggregates);
	return result;
}